

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack25_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x1ffffff;
  out[1] = uVar1 >> 0x19;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x19 | (uVar2 & 0x3ffff) << 7;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x12;
  out[2] = uVar2 >> 0x12 | (uVar1 & 0x7ff) << 0xe;
  out[3] = uVar1 >> 0xb;
  uVar2 = in[3];
  out[3] = uVar1 >> 0xb | (uVar2 & 0xf) << 0x15;
  out[4] = uVar2 >> 4 & 0x1ffffff;
  uVar1 = in[4];
  out[5] = uVar2 >> 0x1d;
  out[5] = uVar2 >> 0x1d | (uVar1 & 0x3fffff) << 3;
  out[6] = uVar1 >> 0x16;
  uVar2 = in[5];
  uVar3 = in[6];
  out[6] = uVar1 >> 0x16 | (uVar2 & 0x7fff) << 10;
  out[7] = uVar2 >> 0xf;
  out[7] = uVar2 >> 0xf | (uVar3 & 0xff) << 0x11;
  uVar1 = in[7];
  out[8] = uVar3 >> 8;
  out[8] = uVar3 >> 8 | (uVar1 & 1) << 0x18;
  out[9] = uVar1 >> 1 & 0x1ffffff;
  uVar2 = in[8];
  out[10] = uVar1 >> 0x1a;
  out[10] = uVar1 >> 0x1a | (uVar2 & 0x7ffff) << 6;
  out[0xb] = uVar2 >> 0x13;
  uVar1 = in[9];
  out[0xb] = uVar2 >> 0x13 | (uVar1 & 0xfff) << 0xd;
  out[0xc] = uVar1 >> 0xc;
  uVar2 = in[10];
  out[0xc] = uVar1 >> 0xc | (uVar2 & 0x1f) << 0x14;
  out[0xd] = uVar2 >> 5 & 0x1ffffff;
  out[0xe] = uVar2 >> 0x1e;
  uVar1 = in[0xb];
  uVar3 = in[0xc];
  out[0xe] = uVar2 >> 0x1e | (uVar1 & 0x7fffff) << 2;
  out[0xf] = uVar1 >> 0x17;
  out[0xf] = uVar1 >> 0x17 | (uVar3 & 0xffff) << 9;
  uVar1 = in[0xd];
  out[0x10] = uVar3 >> 0x10;
  out[0x10] = uVar3 >> 0x10 | (uVar1 & 0x1ff) << 0x10;
  out[0x11] = uVar1 >> 9;
  uVar2 = in[0xe];
  out[0x11] = uVar1 >> 9 | (uVar2 & 3) << 0x17;
  out[0x12] = uVar2 >> 2 & 0x1ffffff;
  out[0x13] = uVar2 >> 0x1b;
  uVar1 = in[0xf];
  out[0x13] = uVar2 >> 0x1b | (uVar1 & 0xfffff) << 5;
  out[0x14] = uVar1 >> 0x14;
  uVar2 = in[0x10];
  out[0x14] = uVar1 >> 0x14 | (uVar2 & 0x1fff) << 0xc;
  uVar1 = in[0x11];
  out[0x15] = uVar2 >> 0xd;
  out[0x15] = uVar2 >> 0xd | (uVar1 & 0x3f) << 0x13;
  uVar2 = in[0x12];
  out[0x16] = uVar1 >> 6 & 0x1ffffff;
  out[0x17] = uVar1 >> 0x1f;
  out[0x17] = uVar1 >> 0x1f | (uVar2 & 0xffffff) << 1;
  uVar1 = in[0x13];
  out[0x18] = uVar2 >> 0x18;
  out[0x18] = uVar2 >> 0x18 | (uVar1 & 0x1ffff) << 8;
  out[0x19] = uVar1 >> 0x11;
  uVar2 = in[0x14];
  uVar3 = in[0x15];
  out[0x19] = uVar1 >> 0x11 | (uVar2 & 0x3ff) << 0xf;
  out[0x1a] = uVar2 >> 10;
  out[0x1a] = uVar2 >> 10 | (uVar3 & 7) << 0x16;
  out[0x1b] = uVar3 >> 3 & 0x1ffffff;
  out[0x1c] = uVar3 >> 0x1c;
  uVar1 = in[0x16];
  out[0x1c] = uVar3 >> 0x1c | (uVar1 & 0x1fffff) << 4;
  uVar2 = in[0x17];
  out[0x1d] = uVar1 >> 0x15;
  out[0x1d] = uVar1 >> 0x15 | (uVar2 & 0x3fff) << 0xb;
  out[0x1e] = uVar2 >> 0xe;
  uVar1 = in[0x18];
  out[0x1e] = uVar2 >> 0xe | (uVar1 & 0x7f) << 0x12;
  out[0x1f] = uVar1 >> 7;
  return in + 0x19;
}

Assistant:

const uint32_t *__fastunpack25_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 18)) << (25 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 11)) << (25 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 4)) << (25 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 25);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 22)) << (25 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 15)) << (25 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 8)) << (25 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 1)) << (25 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 25);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 19)) << (25 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 12)) << (25 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 5)) << (25 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 25);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 23)) << (25 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 16)) << (25 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 9)) << (25 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 2)) << (25 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 25);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 20)) << (25 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 13)) << (25 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 6)) << (25 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 25);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 24)) << (25 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 17)) << (25 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 10)) << (25 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 3)) << (25 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 25);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 21)) << (25 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 14)) << (25 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 7)) << (25 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  out++;

  return in;
}